

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-to-half-open-connection.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      if (nread != -0xfff) goto LAB_001751ff;
      puts("GOT EOF");
      uv_close(tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001751ff:
  read_cb_cold_1();
  if (tcp != (uv_stream_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(tcp,0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  if (nread < 0) {
    fprintf(stderr, "read_cb error: %s\n", uv_err_name(nread));
    ASSERT(nread == UV_ECONNRESET || nread == UV_EOF);

    uv_close((uv_handle_t*)&tcp_server, NULL);
    uv_close((uv_handle_t*)&tcp_peer, NULL);
  }

  read_cb_called++;
}